

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

void secp256k1_compute_prehash
               (secp256k1_context *ctx,uchar *output,secp256k1_pubkey *pubkeys,size_t n_pubkeys,
               secp256k1_fe *nonce_ge_x,uchar *msghash32)

{
  int iVar1;
  bool bVar2;
  size_t buflen;
  uchar buf [33];
  secp256k1_sha256 local_98;
  
  buflen = 0x21;
  local_98.s[0] = 0x6a09e667;
  local_98.s[1] = 0xbb67ae85;
  local_98.s[2] = 0x3c6ef372;
  local_98.s[3] = 0xa54ff53a;
  local_98.s[4] = 0x510e527f;
  local_98.s[5] = 0x9b05688c;
  local_98.s[6] = 0x1f83d9ab;
  local_98.s[7] = 0x5be0cd19;
  local_98.bytes = 0;
  secp256k1_fe_get_b32(buf,nonce_ge_x);
  secp256k1_sha256_write(&local_98,buf,0x20);
  while( true ) {
    bVar2 = n_pubkeys == 0;
    n_pubkeys = n_pubkeys - 1;
    if (bVar2) {
      secp256k1_sha256_write(&local_98,msghash32,0x20);
      secp256k1_sha256_finalize(&local_98,output);
      return;
    }
    iVar1 = secp256k1_ec_pubkey_serialize(ctx,buf,&buflen,pubkeys,0x102);
    if (iVar1 == 0) break;
    secp256k1_sha256_write(&local_98,buf,0x21);
    pubkeys = pubkeys + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/tangramproject[P]secp256k1-zkp/src/modules/aggsig/main_impl.h"
          ,0x4f,
          "test condition failed: secp256k1_ec_pubkey_serialize(ctx, buf, &buflen, &pubkeys[i], SECP256K1_EC_COMPRESSED)"
         );
  abort();
}

Assistant:

static void secp256k1_compute_prehash(const secp256k1_context *ctx, unsigned char *output, const secp256k1_pubkey *pubkeys, size_t n_pubkeys, const secp256k1_fe *nonce_ge_x, const unsigned char *msghash32) {
    size_t i;
    unsigned char buf[33];
    size_t buflen = sizeof(buf);
    secp256k1_sha256 hasher;
    secp256k1_sha256_initialize(&hasher);

    /* Encode nonce */
    secp256k1_fe_get_b32(buf, nonce_ge_x);
    secp256k1_sha256_write(&hasher, buf, 32);

    /* Encode pubkeys */
    for (i = 0; i < n_pubkeys; i++) {
        CHECK(secp256k1_ec_pubkey_serialize(ctx, buf, &buflen, &pubkeys[i], SECP256K1_EC_COMPRESSED));
        secp256k1_sha256_write(&hasher, buf, sizeof(buf));
    }

    /* Encode message */
    secp256k1_sha256_write(&hasher, msghash32, 32);

    /* Finish */
    secp256k1_sha256_finalize(&hasher, output);
}